

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::BaseTimeCoordinator::processDependencyUpdateMessage
          (BaseTimeCoordinator *this,ActionMessage *cmd)

{
  uint16_t uVar1;
  GlobalFederateId GVar2;
  char cVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  DependencyInfo *pDVar5;
  ulong uVar6;
  int iVar4;
  
  switch(cmd->messageAction) {
  case cmd_add_dependency:
    iVar4 = (*this->_vptr_BaseTimeCoordinator[4])(this,(ulong)(uint)(cmd->source_id).gid);
    cVar3 = (char)iVar4;
    goto LAB_0035c59e;
  case cmd_remove_dependency:
    uVar6 = (ulong)(uint)(cmd->source_id).gid;
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseTimeCoordinator[6];
    break;
  case cmd_add_dependency|cmd_user_disconnect:
  case cmd_add_dependency|cmd_disconnect:
  case cmd_add_dependent|cmd_user_disconnect:
  case cmd_add_dependent|cmd_disconnect:
    goto switchD_0035c515_caseD_8e;
  case cmd_add_dependent:
    uVar6 = (ulong)(uint)(cmd->source_id).gid;
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseTimeCoordinator[5];
    break;
  case cmd_add_interdependency:
    iVar4 = (*this->_vptr_BaseTimeCoordinator[4])(this,(ulong)(uint)(cmd->source_id).gid);
    cVar3 = (char)iVar4;
    (*this->_vptr_BaseTimeCoordinator[5])(this,(ulong)(uint)(cmd->source_id).gid);
LAB_0035c59e:
    if (cVar3 != '\0') {
      if ((((cmd->flags & 0x4000) != 0) &&
          (GVar2.gid = (cmd->source_id).gid, (this->mSourceId).gid != GVar2.gid)) &&
         (pDVar5 = TimeDependencies::getDependencyInfo(&this->dependencies,GVar2),
         pDVar5 != (DependencyInfo *)0x0)) {
        pDVar5->connection = CHILD;
      }
      if ((((cmd->flags & 0x2000) != 0) &&
          (GVar2.gid = (cmd->source_id).gid, (this->mSourceId).gid != GVar2.gid)) &&
         (pDVar5 = TimeDependencies::getDependencyInfo(&this->dependencies,GVar2),
         pDVar5 != (DependencyInfo *)0x0)) {
        pDVar5->connection = PARENT;
        this->noParent = false;
      }
      uVar1 = cmd->counter;
      if ((uVar1 != 0) &&
         (pDVar5 = TimeDependencies::getDependencyInfo
                             (&this->dependencies,(GlobalFederateId)(cmd->source_id).gid),
         pDVar5 != (DependencyInfo *)0x0)) {
        (pDVar5->super_TimeData).timingVersion = (int8_t)uVar1;
      }
    }
switchD_0035c515_caseD_8e:
    return;
  case cmd_remove_interdependency:
    (*this->_vptr_BaseTimeCoordinator[6])(this,(ulong)(uint)(cmd->source_id).gid);
  case cmd_remove_dependent:
    uVar6 = (ulong)(uint)(cmd->source_id).gid;
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseTimeCoordinator[7];
    break;
  default:
    if (cmd->messageAction == cmd_timing_info) {
      TimeDependencies::updateTime(&this->dependencies,cmd);
      return;
    }
    goto switchD_0035c515_caseD_8e;
  }
  (*UNRECOVERED_JUMPTABLE)(this,uVar6);
  return;
}

Assistant:

void BaseTimeCoordinator::processDependencyUpdateMessage(const ActionMessage& cmd)
{
    bool added{false};
    switch (cmd.action()) {
        case CMD_ADD_DEPENDENCY:
            added = addDependency(cmd.source_id);
            break;
        case CMD_REMOVE_DEPENDENCY:
            removeDependency(cmd.source_id);
            break;
        case CMD_ADD_DEPENDENT:
            addDependent(cmd.source_id);
            break;
        case CMD_REMOVE_DEPENDENT:
            removeDependent(cmd.source_id);
            break;
        case CMD_ADD_INTERDEPENDENCY:
            added = addDependency(cmd.source_id);
            addDependent(cmd.source_id);
            break;
        case CMD_REMOVE_INTERDEPENDENCY:
            removeDependency(cmd.source_id);
            removeDependent(cmd.source_id);
            break;
        case CMD_TIMING_INFO:
            dependencies.updateTime(cmd);
            break;
        default:
            break;
    }
    if (added) {
        if (checkActionFlag(cmd, child_flag)) {
            setAsChild(cmd.source_id);
        }
        if (checkActionFlag(cmd, parent_flag)) {
            setAsParent(cmd.source_id);
        }
        if (cmd.counter > 0) {
            setVersion(cmd.source_id, cmd.counter);
        }
    }
}